

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O0

Dimension_ConstantDimension * __thiscall
CoreML::Specification::MILSpec::Dimension::mutable_constant(Dimension *this)

{
  bool bVar1;
  Dimension_ConstantDimension *this_00;
  Dimension *this_local;
  
  bVar1 = has_constant(this);
  if (!bVar1) {
    clear_dimension(this);
    set_has_constant(this);
    this_00 = (Dimension_ConstantDimension *)operator_new(0x20);
    Dimension_ConstantDimension::Dimension_ConstantDimension(this_00);
    (this->dimension_).constant_ = this_00;
  }
  return (this->dimension_).constant_;
}

Assistant:

inline ::CoreML::Specification::MILSpec::Dimension_ConstantDimension* Dimension::mutable_constant() {
  if (!has_constant()) {
    clear_dimension();
    set_has_constant();
    dimension_.constant_ = new ::CoreML::Specification::MILSpec::Dimension_ConstantDimension;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.MILSpec.Dimension.constant)
  return dimension_.constant_;
}